

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int utf8_char_whitespace(utf8_char_t *c)

{
  utf8_char_t *c_local;
  int local_4;
  
  if ((c == (utf8_char_t *)0x0) || (((-1 < *c && (*c < '!')) || (*c == '\x7f')))) {
    local_4 = 1;
  }
  else if ((*c == -0x3e) && (c[1] == -0x60)) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int utf8_char_whitespace(const utf8_char_t* c)
{
    // 0x7F is DEL
    if (!c || (c[0] >= 0 && c[0] <= ' ') || c[0] == 0x7F) {
        return 1;
    }

    // EIA608_CHAR_NO_BREAK_SPACE TODO other utf8 spaces
    if (0xC2 == (unsigned char)c[0] && 0xA0 == (unsigned char)c[1]) {
        return 1;
    }

    return 0;
}